

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O1

void gladLoadGLLoader(GLADloadproc load)

{
  GLubyte GVar1;
  GLubyte *pGVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  
  GLVersion.major = 0;
  GLVersion.minor = 0;
  glad_glGetString = (PFNGLGETSTRINGPROC)(*load)("glGetString");
  if (glad_glGetString != (PFNGLGETSTRINGPROC)0x0) {
    pGVar2 = (*glad_glGetString)(0x1f02);
    iVar4 = (int)(char)*pGVar2;
    GLAD_GL_VERSION_2_0 = (int)(0x32 < iVar4);
    uVar3 = (uint)(0x32 < iVar4);
    uVar6 = (uint)(0x33 < iVar4);
    GLAD_GL_VERSION_1_0 = (int)(0x31 < iVar4);
    GLVersion.major = iVar4 + -0x30;
    GVar1 = pGVar2[2];
    uVar5 = (uint)(0x31 < iVar4);
    GLAD_GL_VERSION_1_3 = uVar5;
    if ('2' < (char)GVar1) {
      GLAD_GL_VERSION_1_3 = 1;
    }
    GLAD_GL_VERSION_1_4 = uVar5;
    if ('3' < (char)GVar1) {
      GLAD_GL_VERSION_1_4 = 1;
    }
    GLAD_GL_VERSION_1_5 = GLAD_GL_VERSION_1_0;
    if ('4' < (char)GVar1) {
      GLAD_GL_VERSION_1_5 = 1;
    }
    GLAD_GL_VERSION_3_2 = uVar6;
    GLAD_GL_VERSION_1_2 = uVar5;
    if ('1' < (char)GVar1) {
      GLAD_GL_VERSION_1_2 = 1;
      GLAD_GL_VERSION_3_2 = 1;
    }
    GLAD_GL_VERSION_1_1 = uVar5;
    if ('0' < (char)GVar1) {
      GLAD_GL_VERSION_1_1 = 1;
    }
    GLAD_GL_VERSION_3_1 = uVar6;
    GLAD_GL_VERSION_2_1 = uVar3;
    if ('0' < (char)GVar1) {
      GLAD_GL_VERSION_2_1 = 1;
      GLAD_GL_VERSION_3_1 = 1;
    }
    if ('/' < (char)GVar1) {
      GLAD_GL_VERSION_1_0 = 1;
    }
    GLVersion.minor = (char)GVar1 + -0x30;
    GLAD_GL_VERSION_3_0 = uVar6;
    if ('/' < (char)GVar1) {
      GLAD_GL_VERSION_2_0 = 1;
      GLAD_GL_VERSION_3_0 = 1;
    }
    if (GLVersion.major != 1) {
      GLAD_GL_VERSION_1_0 = uVar5;
      GLAD_GL_VERSION_1_5 = uVar5;
      GLAD_GL_VERSION_1_3 = uVar5;
      GLAD_GL_VERSION_1_1 = uVar5;
      GLAD_GL_VERSION_1_2 = uVar5;
      GLAD_GL_VERSION_1_4 = uVar5;
    }
    if (GLVersion.major != 2) {
      GLAD_GL_VERSION_2_1 = uVar3;
      GLAD_GL_VERSION_2_0 = uVar3;
    }
    if (GLVersion.major != 3) {
      GLAD_GL_VERSION_3_2 = (uint)(0x33 < iVar4);
      GLAD_GL_VERSION_3_0 = uVar6;
      GLAD_GL_VERSION_3_1 = uVar6;
    }
    if (GLAD_GL_VERSION_1_0 != 0) {
      glad_glCullFace = (PFNGLCULLFACEPROC)(*load)("glCullFace");
      glad_glFrontFace = (PFNGLFRONTFACEPROC)(*load)("glFrontFace");
      glad_glHint = (PFNGLHINTPROC)(*load)("glHint");
      glad_glLineWidth = (PFNGLLINEWIDTHPROC)(*load)("glLineWidth");
      glad_glPointSize = (PFNGLPOINTSIZEPROC)(*load)("glPointSize");
      glad_glPolygonMode = (PFNGLPOLYGONMODEPROC)(*load)("glPolygonMode");
      glad_glScissor = (PFNGLSCISSORPROC)(*load)("glScissor");
      glad_glTexParameterf = (PFNGLTEXPARAMETERFPROC)(*load)("glTexParameterf");
      glad_glTexParameterfv = (PFNGLTEXPARAMETERFVPROC)(*load)("glTexParameterfv");
      glad_glTexParameteri = (PFNGLTEXPARAMETERIPROC)(*load)("glTexParameteri");
      glad_glTexParameteriv = (PFNGLTEXPARAMETERIVPROC)(*load)("glTexParameteriv");
      glad_glTexImage1D = (PFNGLTEXIMAGE1DPROC)(*load)("glTexImage1D");
      glad_glTexImage2D = (PFNGLTEXIMAGE2DPROC)(*load)("glTexImage2D");
      glad_glDrawBuffer = (PFNGLDRAWBUFFERPROC)(*load)("glDrawBuffer");
      glad_glClear = (PFNGLCLEARPROC)(*load)("glClear");
      glad_glClearColor = (PFNGLCLEARCOLORPROC)(*load)("glClearColor");
      glad_glClearStencil = (PFNGLCLEARSTENCILPROC)(*load)("glClearStencil");
      glad_glClearDepth = (PFNGLCLEARDEPTHPROC)(*load)("glClearDepth");
      glad_glStencilMask = (PFNGLSTENCILMASKPROC)(*load)("glStencilMask");
      glad_glColorMask = (PFNGLCOLORMASKPROC)(*load)("glColorMask");
      glad_glDepthMask = (PFNGLDEPTHMASKPROC)(*load)("glDepthMask");
      glad_glDisable = (PFNGLDISABLEPROC)(*load)("glDisable");
      glad_glEnable = (PFNGLENABLEPROC)(*load)("glEnable");
      glad_glFinish = (PFNGLFINISHPROC)(*load)("glFinish");
      glad_glFlush = (PFNGLFLUSHPROC)(*load)("glFlush");
      glad_glBlendFunc = (PFNGLBLENDFUNCPROC)(*load)("glBlendFunc");
      glad_glLogicOp = (PFNGLLOGICOPPROC)(*load)("glLogicOp");
      glad_glStencilFunc = (PFNGLSTENCILFUNCPROC)(*load)("glStencilFunc");
      glad_glStencilOp = (PFNGLSTENCILOPPROC)(*load)("glStencilOp");
      glad_glDepthFunc = (PFNGLDEPTHFUNCPROC)(*load)("glDepthFunc");
      glad_glPixelStoref = (PFNGLPIXELSTOREFPROC)(*load)("glPixelStoref");
      glad_glPixelStorei = (PFNGLPIXELSTOREIPROC)(*load)("glPixelStorei");
      glad_glReadBuffer = (PFNGLREADBUFFERPROC)(*load)("glReadBuffer");
      glad_glReadPixels = (PFNGLREADPIXELSPROC)(*load)("glReadPixels");
      glad_glGetBooleanv = (PFNGLGETBOOLEANVPROC)(*load)("glGetBooleanv");
      glad_glGetDoublev = (PFNGLGETDOUBLEVPROC)(*load)("glGetDoublev");
      glad_glGetError = (PFNGLGETERRORPROC)(*load)("glGetError");
      glad_glGetFloatv = (PFNGLGETFLOATVPROC)(*load)("glGetFloatv");
      glad_glGetIntegerv = (PFNGLGETINTEGERVPROC)(*load)("glGetIntegerv");
      glad_glGetString = (PFNGLGETSTRINGPROC)(*load)("glGetString");
      glad_glGetTexImage = (PFNGLGETTEXIMAGEPROC)(*load)("glGetTexImage");
      glad_glGetTexParameterfv = (PFNGLGETTEXPARAMETERFVPROC)(*load)("glGetTexParameterfv");
      glad_glGetTexParameteriv = (PFNGLGETTEXPARAMETERIVPROC)(*load)("glGetTexParameteriv");
      glad_glGetTexLevelParameterfv =
           (PFNGLGETTEXLEVELPARAMETERFVPROC)(*load)("glGetTexLevelParameterfv");
      glad_glGetTexLevelParameteriv =
           (PFNGLGETTEXLEVELPARAMETERIVPROC)(*load)("glGetTexLevelParameteriv");
      glad_glIsEnabled = (PFNGLISENABLEDPROC)(*load)("glIsEnabled");
      glad_glDepthRange = (PFNGLDEPTHRANGEPROC)(*load)("glDepthRange");
      glad_glViewport = (PFNGLVIEWPORTPROC)(*load)("glViewport");
    }
    if (GLAD_GL_VERSION_1_1 != 0) {
      glad_glDrawArrays = (PFNGLDRAWARRAYSPROC)(*load)("glDrawArrays");
      glad_glDrawElements = (PFNGLDRAWELEMENTSPROC)(*load)("glDrawElements");
      glad_glPolygonOffset = (PFNGLPOLYGONOFFSETPROC)(*load)("glPolygonOffset");
      glad_glCopyTexImage1D = (PFNGLCOPYTEXIMAGE1DPROC)(*load)("glCopyTexImage1D");
      glad_glCopyTexImage2D = (PFNGLCOPYTEXIMAGE2DPROC)(*load)("glCopyTexImage2D");
      glad_glCopyTexSubImage1D = (PFNGLCOPYTEXSUBIMAGE1DPROC)(*load)("glCopyTexSubImage1D");
      glad_glCopyTexSubImage2D = (PFNGLCOPYTEXSUBIMAGE2DPROC)(*load)("glCopyTexSubImage2D");
      glad_glTexSubImage1D = (PFNGLTEXSUBIMAGE1DPROC)(*load)("glTexSubImage1D");
      glad_glTexSubImage2D = (PFNGLTEXSUBIMAGE2DPROC)(*load)("glTexSubImage2D");
      glad_glBindTexture = (PFNGLBINDTEXTUREPROC)(*load)("glBindTexture");
      glad_glDeleteTextures = (PFNGLDELETETEXTURESPROC)(*load)("glDeleteTextures");
      glad_glGenTextures = (PFNGLGENTEXTURESPROC)(*load)("glGenTextures");
      glad_glIsTexture = (PFNGLISTEXTUREPROC)(*load)("glIsTexture");
    }
    if (GLAD_GL_VERSION_1_2 != 0) {
      glad_glDrawRangeElements = (PFNGLDRAWRANGEELEMENTSPROC)(*load)("glDrawRangeElements");
      glad_glTexImage3D = (PFNGLTEXIMAGE3DPROC)(*load)("glTexImage3D");
      glad_glTexSubImage3D = (PFNGLTEXSUBIMAGE3DPROC)(*load)("glTexSubImage3D");
      glad_glCopyTexSubImage3D = (PFNGLCOPYTEXSUBIMAGE3DPROC)(*load)("glCopyTexSubImage3D");
    }
    if (GLAD_GL_VERSION_1_3 != 0) {
      glad_glActiveTexture = (PFNGLACTIVETEXTUREPROC)(*load)("glActiveTexture");
      glad_glSampleCoverage = (PFNGLSAMPLECOVERAGEPROC)(*load)("glSampleCoverage");
      glad_glCompressedTexImage3D = (PFNGLCOMPRESSEDTEXIMAGE3DPROC)(*load)("glCompressedTexImage3D")
      ;
      glad_glCompressedTexImage2D = (PFNGLCOMPRESSEDTEXIMAGE2DPROC)(*load)("glCompressedTexImage2D")
      ;
      glad_glCompressedTexImage1D = (PFNGLCOMPRESSEDTEXIMAGE1DPROC)(*load)("glCompressedTexImage1D")
      ;
      glad_glCompressedTexSubImage3D =
           (PFNGLCOMPRESSEDTEXSUBIMAGE3DPROC)(*load)("glCompressedTexSubImage3D");
      glad_glCompressedTexSubImage2D =
           (PFNGLCOMPRESSEDTEXSUBIMAGE2DPROC)(*load)("glCompressedTexSubImage2D");
      glad_glCompressedTexSubImage1D =
           (PFNGLCOMPRESSEDTEXSUBIMAGE1DPROC)(*load)("glCompressedTexSubImage1D");
      glad_glGetCompressedTexImage =
           (PFNGLGETCOMPRESSEDTEXIMAGEPROC)(*load)("glGetCompressedTexImage");
    }
    if (GLAD_GL_VERSION_1_4 != 0) {
      glad_glBlendFuncSeparate = (PFNGLBLENDFUNCSEPARATEPROC)(*load)("glBlendFuncSeparate");
      glad_glMultiDrawArrays = (PFNGLMULTIDRAWARRAYSPROC)(*load)("glMultiDrawArrays");
      glad_glMultiDrawElements = (PFNGLMULTIDRAWELEMENTSPROC)(*load)("glMultiDrawElements");
      glad_glPointParameterf = (PFNGLPOINTPARAMETERFPROC)(*load)("glPointParameterf");
      glad_glPointParameterfv = (PFNGLPOINTPARAMETERFVPROC)(*load)("glPointParameterfv");
      glad_glPointParameteri = (PFNGLPOINTPARAMETERIPROC)(*load)("glPointParameteri");
      glad_glPointParameteriv = (PFNGLPOINTPARAMETERIVPROC)(*load)("glPointParameteriv");
      glad_glBlendColor = (PFNGLBLENDCOLORPROC)(*load)("glBlendColor");
      glad_glBlendEquation = (PFNGLBLENDEQUATIONPROC)(*load)("glBlendEquation");
    }
    if (GLAD_GL_VERSION_1_5 != 0) {
      glad_glGenQueries = (PFNGLGENQUERIESPROC)(*load)("glGenQueries");
      glad_glDeleteQueries = (PFNGLDELETEQUERIESPROC)(*load)("glDeleteQueries");
      glad_glIsQuery = (PFNGLISQUERYPROC)(*load)("glIsQuery");
      glad_glBeginQuery = (PFNGLBEGINQUERYPROC)(*load)("glBeginQuery");
      glad_glEndQuery = (PFNGLENDQUERYPROC)(*load)("glEndQuery");
      glad_glGetQueryiv = (PFNGLGETQUERYIVPROC)(*load)("glGetQueryiv");
      glad_glGetQueryObjectiv = (PFNGLGETQUERYOBJECTIVPROC)(*load)("glGetQueryObjectiv");
      glad_glGetQueryObjectuiv = (PFNGLGETQUERYOBJECTUIVPROC)(*load)("glGetQueryObjectuiv");
      glad_glBindBuffer = (PFNGLBINDBUFFERPROC)(*load)("glBindBuffer");
      glad_glDeleteBuffers = (PFNGLDELETEBUFFERSPROC)(*load)("glDeleteBuffers");
      glad_glGenBuffers = (PFNGLGENBUFFERSPROC)(*load)("glGenBuffers");
      glad_glIsBuffer = (PFNGLISBUFFERPROC)(*load)("glIsBuffer");
      glad_glBufferData = (PFNGLBUFFERDATAPROC)(*load)("glBufferData");
      glad_glBufferSubData = (PFNGLBUFFERSUBDATAPROC)(*load)("glBufferSubData");
      glad_glGetBufferSubData = (PFNGLGETBUFFERSUBDATAPROC)(*load)("glGetBufferSubData");
      glad_glMapBuffer = (PFNGLMAPBUFFERPROC)(*load)("glMapBuffer");
      glad_glUnmapBuffer = (PFNGLUNMAPBUFFERPROC)(*load)("glUnmapBuffer");
      glad_glGetBufferParameteriv = (PFNGLGETBUFFERPARAMETERIVPROC)(*load)("glGetBufferParameteriv")
      ;
      glad_glGetBufferPointerv = (PFNGLGETBUFFERPOINTERVPROC)(*load)("glGetBufferPointerv");
    }
    if (GLAD_GL_VERSION_2_0 != 0) {
      glad_glBlendEquationSeparate =
           (PFNGLBLENDEQUATIONSEPARATEPROC)(*load)("glBlendEquationSeparate");
      glad_glDrawBuffers = (PFNGLDRAWBUFFERSPROC)(*load)("glDrawBuffers");
      glad_glStencilOpSeparate = (PFNGLSTENCILOPSEPARATEPROC)(*load)("glStencilOpSeparate");
      glad_glStencilFuncSeparate = (PFNGLSTENCILFUNCSEPARATEPROC)(*load)("glStencilFuncSeparate");
      glad_glStencilMaskSeparate = (PFNGLSTENCILMASKSEPARATEPROC)(*load)("glStencilMaskSeparate");
      glad_glAttachShader = (PFNGLATTACHSHADERPROC)(*load)("glAttachShader");
      glad_glBindAttribLocation = (PFNGLBINDATTRIBLOCATIONPROC)(*load)("glBindAttribLocation");
      glad_glCompileShader = (PFNGLCOMPILESHADERPROC)(*load)("glCompileShader");
      glad_glCreateProgram = (PFNGLCREATEPROGRAMPROC)(*load)("glCreateProgram");
      glad_glCreateShader = (PFNGLCREATESHADERPROC)(*load)("glCreateShader");
      glad_glDeleteProgram = (PFNGLDELETEPROGRAMPROC)(*load)("glDeleteProgram");
      glad_glDeleteShader = (PFNGLDELETESHADERPROC)(*load)("glDeleteShader");
      glad_glDetachShader = (PFNGLDETACHSHADERPROC)(*load)("glDetachShader");
      glad_glDisableVertexAttribArray =
           (PFNGLDISABLEVERTEXATTRIBARRAYPROC)(*load)("glDisableVertexAttribArray");
      glad_glEnableVertexAttribArray =
           (PFNGLENABLEVERTEXATTRIBARRAYPROC)(*load)("glEnableVertexAttribArray");
      glad_glGetActiveAttrib = (PFNGLGETACTIVEATTRIBPROC)(*load)("glGetActiveAttrib");
      glad_glGetActiveUniform = (PFNGLGETACTIVEUNIFORMPROC)(*load)("glGetActiveUniform");
      glad_glGetAttachedShaders = (PFNGLGETATTACHEDSHADERSPROC)(*load)("glGetAttachedShaders");
      glad_glGetAttribLocation = (PFNGLGETATTRIBLOCATIONPROC)(*load)("glGetAttribLocation");
      glad_glGetProgramiv = (PFNGLGETPROGRAMIVPROC)(*load)("glGetProgramiv");
      glad_glGetProgramInfoLog = (PFNGLGETPROGRAMINFOLOGPROC)(*load)("glGetProgramInfoLog");
      glad_glGetShaderiv = (PFNGLGETSHADERIVPROC)(*load)("glGetShaderiv");
      glad_glGetShaderInfoLog = (PFNGLGETSHADERINFOLOGPROC)(*load)("glGetShaderInfoLog");
      glad_glGetShaderSource = (PFNGLGETSHADERSOURCEPROC)(*load)("glGetShaderSource");
      glad_glGetUniformLocation = (PFNGLGETUNIFORMLOCATIONPROC)(*load)("glGetUniformLocation");
      glad_glGetUniformfv = (PFNGLGETUNIFORMFVPROC)(*load)("glGetUniformfv");
      glad_glGetUniformiv = (PFNGLGETUNIFORMIVPROC)(*load)("glGetUniformiv");
      glad_glGetVertexAttribdv = (PFNGLGETVERTEXATTRIBDVPROC)(*load)("glGetVertexAttribdv");
      glad_glGetVertexAttribfv = (PFNGLGETVERTEXATTRIBFVPROC)(*load)("glGetVertexAttribfv");
      glad_glGetVertexAttribiv = (PFNGLGETVERTEXATTRIBIVPROC)(*load)("glGetVertexAttribiv");
      glad_glGetVertexAttribPointerv =
           (PFNGLGETVERTEXATTRIBPOINTERVPROC)(*load)("glGetVertexAttribPointerv");
      glad_glIsProgram = (PFNGLISPROGRAMPROC)(*load)("glIsProgram");
      glad_glIsShader = (PFNGLISSHADERPROC)(*load)("glIsShader");
      glad_glLinkProgram = (PFNGLLINKPROGRAMPROC)(*load)("glLinkProgram");
      glad_glShaderSource = (PFNGLSHADERSOURCEPROC)(*load)("glShaderSource");
      glad_glUseProgram = (PFNGLUSEPROGRAMPROC)(*load)("glUseProgram");
      glad_glUniform1f = (PFNGLUNIFORM1FPROC)(*load)("glUniform1f");
      glad_glUniform2f = (PFNGLUNIFORM2FPROC)(*load)("glUniform2f");
      glad_glUniform3f = (PFNGLUNIFORM3FPROC)(*load)("glUniform3f");
      glad_glUniform4f = (PFNGLUNIFORM4FPROC)(*load)("glUniform4f");
      glad_glUniform1i = (PFNGLUNIFORM1IPROC)(*load)("glUniform1i");
      glad_glUniform2i = (PFNGLUNIFORM2IPROC)(*load)("glUniform2i");
      glad_glUniform3i = (PFNGLUNIFORM3IPROC)(*load)("glUniform3i");
      glad_glUniform4i = (PFNGLUNIFORM4IPROC)(*load)("glUniform4i");
      glad_glUniform1fv = (PFNGLUNIFORM1FVPROC)(*load)("glUniform1fv");
      glad_glUniform2fv = (PFNGLUNIFORM2FVPROC)(*load)("glUniform2fv");
      glad_glUniform3fv = (PFNGLUNIFORM3FVPROC)(*load)("glUniform3fv");
      glad_glUniform4fv = (PFNGLUNIFORM4FVPROC)(*load)("glUniform4fv");
      glad_glUniform1iv = (PFNGLUNIFORM1IVPROC)(*load)("glUniform1iv");
      glad_glUniform2iv = (PFNGLUNIFORM2IVPROC)(*load)("glUniform2iv");
      glad_glUniform3iv = (PFNGLUNIFORM3IVPROC)(*load)("glUniform3iv");
      glad_glUniform4iv = (PFNGLUNIFORM4IVPROC)(*load)("glUniform4iv");
      glad_glUniformMatrix2fv = (PFNGLUNIFORMMATRIX2FVPROC)(*load)("glUniformMatrix2fv");
      glad_glUniformMatrix3fv = (PFNGLUNIFORMMATRIX3FVPROC)(*load)("glUniformMatrix3fv");
      glad_glUniformMatrix4fv = (PFNGLUNIFORMMATRIX4FVPROC)(*load)("glUniformMatrix4fv");
      glad_glValidateProgram = (PFNGLVALIDATEPROGRAMPROC)(*load)("glValidateProgram");
      glad_glVertexAttrib1d = (PFNGLVERTEXATTRIB1DPROC)(*load)("glVertexAttrib1d");
      glad_glVertexAttrib1dv = (PFNGLVERTEXATTRIB1DVPROC)(*load)("glVertexAttrib1dv");
      glad_glVertexAttrib1f = (PFNGLVERTEXATTRIB1FPROC)(*load)("glVertexAttrib1f");
      glad_glVertexAttrib1fv = (PFNGLVERTEXATTRIB1FVPROC)(*load)("glVertexAttrib1fv");
      glad_glVertexAttrib1s = (PFNGLVERTEXATTRIB1SPROC)(*load)("glVertexAttrib1s");
      glad_glVertexAttrib1sv = (PFNGLVERTEXATTRIB1SVPROC)(*load)("glVertexAttrib1sv");
      glad_glVertexAttrib2d = (PFNGLVERTEXATTRIB2DPROC)(*load)("glVertexAttrib2d");
      glad_glVertexAttrib2dv = (PFNGLVERTEXATTRIB2DVPROC)(*load)("glVertexAttrib2dv");
      glad_glVertexAttrib2f = (PFNGLVERTEXATTRIB2FPROC)(*load)("glVertexAttrib2f");
      glad_glVertexAttrib2fv = (PFNGLVERTEXATTRIB2FVPROC)(*load)("glVertexAttrib2fv");
      glad_glVertexAttrib2s = (PFNGLVERTEXATTRIB2SPROC)(*load)("glVertexAttrib2s");
      glad_glVertexAttrib2sv = (PFNGLVERTEXATTRIB2SVPROC)(*load)("glVertexAttrib2sv");
      glad_glVertexAttrib3d = (PFNGLVERTEXATTRIB3DPROC)(*load)("glVertexAttrib3d");
      glad_glVertexAttrib3dv = (PFNGLVERTEXATTRIB3DVPROC)(*load)("glVertexAttrib3dv");
      glad_glVertexAttrib3f = (PFNGLVERTEXATTRIB3FPROC)(*load)("glVertexAttrib3f");
      glad_glVertexAttrib3fv = (PFNGLVERTEXATTRIB3FVPROC)(*load)("glVertexAttrib3fv");
      glad_glVertexAttrib3s = (PFNGLVERTEXATTRIB3SPROC)(*load)("glVertexAttrib3s");
      glad_glVertexAttrib3sv = (PFNGLVERTEXATTRIB3SVPROC)(*load)("glVertexAttrib3sv");
      glad_glVertexAttrib4Nbv = (PFNGLVERTEXATTRIB4NBVPROC)(*load)("glVertexAttrib4Nbv");
      glad_glVertexAttrib4Niv = (PFNGLVERTEXATTRIB4NIVPROC)(*load)("glVertexAttrib4Niv");
      glad_glVertexAttrib4Nsv = (PFNGLVERTEXATTRIB4NSVPROC)(*load)("glVertexAttrib4Nsv");
      glad_glVertexAttrib4Nub = (PFNGLVERTEXATTRIB4NUBPROC)(*load)("glVertexAttrib4Nub");
      glad_glVertexAttrib4Nubv = (PFNGLVERTEXATTRIB4NUBVPROC)(*load)("glVertexAttrib4Nubv");
      glad_glVertexAttrib4Nuiv = (PFNGLVERTEXATTRIB4NUIVPROC)(*load)("glVertexAttrib4Nuiv");
      glad_glVertexAttrib4Nusv = (PFNGLVERTEXATTRIB4NUSVPROC)(*load)("glVertexAttrib4Nusv");
      glad_glVertexAttrib4bv = (PFNGLVERTEXATTRIB4BVPROC)(*load)("glVertexAttrib4bv");
      glad_glVertexAttrib4d = (PFNGLVERTEXATTRIB4DPROC)(*load)("glVertexAttrib4d");
      glad_glVertexAttrib4dv = (PFNGLVERTEXATTRIB4DVPROC)(*load)("glVertexAttrib4dv");
      glad_glVertexAttrib4f = (PFNGLVERTEXATTRIB4FPROC)(*load)("glVertexAttrib4f");
      glad_glVertexAttrib4fv = (PFNGLVERTEXATTRIB4FVPROC)(*load)("glVertexAttrib4fv");
      glad_glVertexAttrib4iv = (PFNGLVERTEXATTRIB4IVPROC)(*load)("glVertexAttrib4iv");
      glad_glVertexAttrib4s = (PFNGLVERTEXATTRIB4SPROC)(*load)("glVertexAttrib4s");
      glad_glVertexAttrib4sv = (PFNGLVERTEXATTRIB4SVPROC)(*load)("glVertexAttrib4sv");
      glad_glVertexAttrib4ubv = (PFNGLVERTEXATTRIB4UBVPROC)(*load)("glVertexAttrib4ubv");
      glad_glVertexAttrib4uiv = (PFNGLVERTEXATTRIB4UIVPROC)(*load)("glVertexAttrib4uiv");
      glad_glVertexAttrib4usv = (PFNGLVERTEXATTRIB4USVPROC)(*load)("glVertexAttrib4usv");
      glad_glVertexAttribPointer = (PFNGLVERTEXATTRIBPOINTERPROC)(*load)("glVertexAttribPointer");
    }
    if (GLAD_GL_VERSION_2_1 != 0) {
      glad_glUniformMatrix2x3fv = (PFNGLUNIFORMMATRIX2X3FVPROC)(*load)("glUniformMatrix2x3fv");
      glad_glUniformMatrix3x2fv = (PFNGLUNIFORMMATRIX3X2FVPROC)(*load)("glUniformMatrix3x2fv");
      glad_glUniformMatrix2x4fv = (PFNGLUNIFORMMATRIX2X4FVPROC)(*load)("glUniformMatrix2x4fv");
      glad_glUniformMatrix4x2fv = (PFNGLUNIFORMMATRIX4X2FVPROC)(*load)("glUniformMatrix4x2fv");
      glad_glUniformMatrix3x4fv = (PFNGLUNIFORMMATRIX3X4FVPROC)(*load)("glUniformMatrix3x4fv");
      glad_glUniformMatrix4x3fv = (PFNGLUNIFORMMATRIX4X3FVPROC)(*load)("glUniformMatrix4x3fv");
    }
    if (GLAD_GL_VERSION_3_0 != 0) {
      glad_glColorMaski = (PFNGLCOLORMASKIPROC)(*load)("glColorMaski");
      glad_glGetBooleani_v = (PFNGLGETBOOLEANI_VPROC)(*load)("glGetBooleani_v");
      glad_glGetIntegeri_v = (PFNGLGETINTEGERI_VPROC)(*load)("glGetIntegeri_v");
      glad_glEnablei = (PFNGLENABLEIPROC)(*load)("glEnablei");
      glad_glDisablei = (PFNGLDISABLEIPROC)(*load)("glDisablei");
      glad_glIsEnabledi = (PFNGLISENABLEDIPROC)(*load)("glIsEnabledi");
      glad_glBeginTransformFeedback =
           (PFNGLBEGINTRANSFORMFEEDBACKPROC)(*load)("glBeginTransformFeedback");
      glad_glEndTransformFeedback = (PFNGLENDTRANSFORMFEEDBACKPROC)(*load)("glEndTransformFeedback")
      ;
      glad_glBindBufferRange = (PFNGLBINDBUFFERRANGEPROC)(*load)("glBindBufferRange");
      glad_glBindBufferBase = (PFNGLBINDBUFFERBASEPROC)(*load)("glBindBufferBase");
      glad_glTransformFeedbackVaryings =
           (PFNGLTRANSFORMFEEDBACKVARYINGSPROC)(*load)("glTransformFeedbackVaryings");
      glad_glGetTransformFeedbackVarying =
           (PFNGLGETTRANSFORMFEEDBACKVARYINGPROC)(*load)("glGetTransformFeedbackVarying");
      glad_glClampColor = (PFNGLCLAMPCOLORPROC)(*load)("glClampColor");
      glad_glBeginConditionalRender =
           (PFNGLBEGINCONDITIONALRENDERPROC)(*load)("glBeginConditionalRender");
      glad_glEndConditionalRender = (PFNGLENDCONDITIONALRENDERPROC)(*load)("glEndConditionalRender")
      ;
      glad_glVertexAttribIPointer = (PFNGLVERTEXATTRIBIPOINTERPROC)(*load)("glVertexAttribIPointer")
      ;
      glad_glGetVertexAttribIiv = (PFNGLGETVERTEXATTRIBIIVPROC)(*load)("glGetVertexAttribIiv");
      glad_glGetVertexAttribIuiv = (PFNGLGETVERTEXATTRIBIUIVPROC)(*load)("glGetVertexAttribIuiv");
      glad_glVertexAttribI1i = (PFNGLVERTEXATTRIBI1IPROC)(*load)("glVertexAttribI1i");
      glad_glVertexAttribI2i = (PFNGLVERTEXATTRIBI2IPROC)(*load)("glVertexAttribI2i");
      glad_glVertexAttribI3i = (PFNGLVERTEXATTRIBI3IPROC)(*load)("glVertexAttribI3i");
      glad_glVertexAttribI4i = (PFNGLVERTEXATTRIBI4IPROC)(*load)("glVertexAttribI4i");
      glad_glVertexAttribI1ui = (PFNGLVERTEXATTRIBI1UIPROC)(*load)("glVertexAttribI1ui");
      glad_glVertexAttribI2ui = (PFNGLVERTEXATTRIBI2UIPROC)(*load)("glVertexAttribI2ui");
      glad_glVertexAttribI3ui = (PFNGLVERTEXATTRIBI3UIPROC)(*load)("glVertexAttribI3ui");
      glad_glVertexAttribI4ui = (PFNGLVERTEXATTRIBI4UIPROC)(*load)("glVertexAttribI4ui");
      glad_glVertexAttribI1iv = (PFNGLVERTEXATTRIBI1IVPROC)(*load)("glVertexAttribI1iv");
      glad_glVertexAttribI2iv = (PFNGLVERTEXATTRIBI2IVPROC)(*load)("glVertexAttribI2iv");
      glad_glVertexAttribI3iv = (PFNGLVERTEXATTRIBI3IVPROC)(*load)("glVertexAttribI3iv");
      glad_glVertexAttribI4iv = (PFNGLVERTEXATTRIBI4IVPROC)(*load)("glVertexAttribI4iv");
      glad_glVertexAttribI1uiv = (PFNGLVERTEXATTRIBI1UIVPROC)(*load)("glVertexAttribI1uiv");
      glad_glVertexAttribI2uiv = (PFNGLVERTEXATTRIBI2UIVPROC)(*load)("glVertexAttribI2uiv");
      glad_glVertexAttribI3uiv = (PFNGLVERTEXATTRIBI3UIVPROC)(*load)("glVertexAttribI3uiv");
      glad_glVertexAttribI4uiv = (PFNGLVERTEXATTRIBI4UIVPROC)(*load)("glVertexAttribI4uiv");
      glad_glVertexAttribI4bv = (PFNGLVERTEXATTRIBI4BVPROC)(*load)("glVertexAttribI4bv");
      glad_glVertexAttribI4sv = (PFNGLVERTEXATTRIBI4SVPROC)(*load)("glVertexAttribI4sv");
      glad_glVertexAttribI4ubv = (PFNGLVERTEXATTRIBI4UBVPROC)(*load)("glVertexAttribI4ubv");
      glad_glVertexAttribI4usv = (PFNGLVERTEXATTRIBI4USVPROC)(*load)("glVertexAttribI4usv");
      glad_glGetUniformuiv = (PFNGLGETUNIFORMUIVPROC)(*load)("glGetUniformuiv");
      glad_glBindFragDataLocation = (PFNGLBINDFRAGDATALOCATIONPROC)(*load)("glBindFragDataLocation")
      ;
      glad_glGetFragDataLocation = (PFNGLGETFRAGDATALOCATIONPROC)(*load)("glGetFragDataLocation");
      glad_glUniform1ui = (PFNGLUNIFORM1UIPROC)(*load)("glUniform1ui");
      glad_glUniform2ui = (PFNGLUNIFORM2UIPROC)(*load)("glUniform2ui");
      glad_glUniform3ui = (PFNGLUNIFORM3UIPROC)(*load)("glUniform3ui");
      glad_glUniform4ui = (PFNGLUNIFORM4UIPROC)(*load)("glUniform4ui");
      glad_glUniform1uiv = (PFNGLUNIFORM1UIVPROC)(*load)("glUniform1uiv");
      glad_glUniform2uiv = (PFNGLUNIFORM2UIVPROC)(*load)("glUniform2uiv");
      glad_glUniform3uiv = (PFNGLUNIFORM3UIVPROC)(*load)("glUniform3uiv");
      glad_glUniform4uiv = (PFNGLUNIFORM4UIVPROC)(*load)("glUniform4uiv");
      glad_glTexParameterIiv = (PFNGLTEXPARAMETERIIVPROC)(*load)("glTexParameterIiv");
      glad_glTexParameterIuiv = (PFNGLTEXPARAMETERIUIVPROC)(*load)("glTexParameterIuiv");
      glad_glGetTexParameterIiv = (PFNGLGETTEXPARAMETERIIVPROC)(*load)("glGetTexParameterIiv");
      glad_glGetTexParameterIuiv = (PFNGLGETTEXPARAMETERIUIVPROC)(*load)("glGetTexParameterIuiv");
      glad_glClearBufferiv = (PFNGLCLEARBUFFERIVPROC)(*load)("glClearBufferiv");
      glad_glClearBufferuiv = (PFNGLCLEARBUFFERUIVPROC)(*load)("glClearBufferuiv");
      glad_glClearBufferfv = (PFNGLCLEARBUFFERFVPROC)(*load)("glClearBufferfv");
      glad_glClearBufferfi = (PFNGLCLEARBUFFERFIPROC)(*load)("glClearBufferfi");
      glad_glGetStringi = (PFNGLGETSTRINGIPROC)(*load)("glGetStringi");
      glad_glIsRenderbuffer = (PFNGLISRENDERBUFFERPROC)(*load)("glIsRenderbuffer");
      glad_glBindRenderbuffer = (PFNGLBINDRENDERBUFFERPROC)(*load)("glBindRenderbuffer");
      glad_glDeleteRenderbuffers = (PFNGLDELETERENDERBUFFERSPROC)(*load)("glDeleteRenderbuffers");
      glad_glGenRenderbuffers = (PFNGLGENRENDERBUFFERSPROC)(*load)("glGenRenderbuffers");
      glad_glRenderbufferStorage = (PFNGLRENDERBUFFERSTORAGEPROC)(*load)("glRenderbufferStorage");
      glad_glGetRenderbufferParameteriv =
           (PFNGLGETRENDERBUFFERPARAMETERIVPROC)(*load)("glGetRenderbufferParameteriv");
      glad_glIsFramebuffer = (PFNGLISFRAMEBUFFERPROC)(*load)("glIsFramebuffer");
      glad_glBindFramebuffer = (PFNGLBINDFRAMEBUFFERPROC)(*load)("glBindFramebuffer");
      glad_glDeleteFramebuffers = (PFNGLDELETEFRAMEBUFFERSPROC)(*load)("glDeleteFramebuffers");
      glad_glGenFramebuffers = (PFNGLGENFRAMEBUFFERSPROC)(*load)("glGenFramebuffers");
      glad_glCheckFramebufferStatus =
           (PFNGLCHECKFRAMEBUFFERSTATUSPROC)(*load)("glCheckFramebufferStatus");
      glad_glFramebufferTexture1D = (PFNGLFRAMEBUFFERTEXTURE1DPROC)(*load)("glFramebufferTexture1D")
      ;
      glad_glFramebufferTexture2D = (PFNGLFRAMEBUFFERTEXTURE2DPROC)(*load)("glFramebufferTexture2D")
      ;
      glad_glFramebufferTexture3D = (PFNGLFRAMEBUFFERTEXTURE3DPROC)(*load)("glFramebufferTexture3D")
      ;
      glad_glFramebufferRenderbuffer =
           (PFNGLFRAMEBUFFERRENDERBUFFERPROC)(*load)("glFramebufferRenderbuffer");
      glad_glGetFramebufferAttachmentParameteriv =
           (PFNGLGETFRAMEBUFFERATTACHMENTPARAMETERIVPROC)
           (*load)("glGetFramebufferAttachmentParameteriv");
      glad_glGenerateMipmap = (PFNGLGENERATEMIPMAPPROC)(*load)("glGenerateMipmap");
      glad_glBlitFramebuffer = (PFNGLBLITFRAMEBUFFERPROC)(*load)("glBlitFramebuffer");
      glad_glRenderbufferStorageMultisample =
           (PFNGLRENDERBUFFERSTORAGEMULTISAMPLEPROC)(*load)("glRenderbufferStorageMultisample");
      glad_glFramebufferTextureLayer =
           (PFNGLFRAMEBUFFERTEXTURELAYERPROC)(*load)("glFramebufferTextureLayer");
      glad_glMapBufferRange = (PFNGLMAPBUFFERRANGEPROC)(*load)("glMapBufferRange");
      glad_glFlushMappedBufferRange =
           (PFNGLFLUSHMAPPEDBUFFERRANGEPROC)(*load)("glFlushMappedBufferRange");
      glad_glBindVertexArray = (PFNGLBINDVERTEXARRAYPROC)(*load)("glBindVertexArray");
      glad_glDeleteVertexArrays = (PFNGLDELETEVERTEXARRAYSPROC)(*load)("glDeleteVertexArrays");
      glad_glGenVertexArrays = (PFNGLGENVERTEXARRAYSPROC)(*load)("glGenVertexArrays");
      glad_glIsVertexArray = (PFNGLISVERTEXARRAYPROC)(*load)("glIsVertexArray");
    }
    if (GLAD_GL_VERSION_3_1 != 0) {
      glad_glDrawArraysInstanced = (PFNGLDRAWARRAYSINSTANCEDPROC)(*load)("glDrawArraysInstanced");
      glad_glDrawElementsInstanced =
           (PFNGLDRAWELEMENTSINSTANCEDPROC)(*load)("glDrawElementsInstanced");
      glad_glTexBuffer = (PFNGLTEXBUFFERPROC)(*load)("glTexBuffer");
      glad_glPrimitiveRestartIndex =
           (PFNGLPRIMITIVERESTARTINDEXPROC)(*load)("glPrimitiveRestartIndex");
      glad_glCopyBufferSubData = (PFNGLCOPYBUFFERSUBDATAPROC)(*load)("glCopyBufferSubData");
      glad_glGetUniformIndices = (PFNGLGETUNIFORMINDICESPROC)(*load)("glGetUniformIndices");
      glad_glGetActiveUniformsiv = (PFNGLGETACTIVEUNIFORMSIVPROC)(*load)("glGetActiveUniformsiv");
      glad_glGetActiveUniformName = (PFNGLGETACTIVEUNIFORMNAMEPROC)(*load)("glGetActiveUniformName")
      ;
      glad_glGetUniformBlockIndex = (PFNGLGETUNIFORMBLOCKINDEXPROC)(*load)("glGetUniformBlockIndex")
      ;
      glad_glGetActiveUniformBlockiv =
           (PFNGLGETACTIVEUNIFORMBLOCKIVPROC)(*load)("glGetActiveUniformBlockiv");
      glad_glGetActiveUniformBlockName =
           (PFNGLGETACTIVEUNIFORMBLOCKNAMEPROC)(*load)("glGetActiveUniformBlockName");
      glad_glUniformBlockBinding = (PFNGLUNIFORMBLOCKBINDINGPROC)(*load)("glUniformBlockBinding");
    }
    if (GLAD_GL_VERSION_3_2 != 0) {
      glad_glDrawElementsBaseVertex =
           (PFNGLDRAWELEMENTSBASEVERTEXPROC)(*load)("glDrawElementsBaseVertex");
      glad_glDrawRangeElementsBaseVertex =
           (PFNGLDRAWRANGEELEMENTSBASEVERTEXPROC)(*load)("glDrawRangeElementsBaseVertex");
      glad_glDrawElementsInstancedBaseVertex =
           (PFNGLDRAWELEMENTSINSTANCEDBASEVERTEXPROC)(*load)("glDrawElementsInstancedBaseVertex");
      glad_glMultiDrawElementsBaseVertex =
           (PFNGLMULTIDRAWELEMENTSBASEVERTEXPROC)(*load)("glMultiDrawElementsBaseVertex");
      glad_glProvokingVertex = (PFNGLPROVOKINGVERTEXPROC)(*load)("glProvokingVertex");
      glad_glFenceSync = (PFNGLFENCESYNCPROC)(*load)("glFenceSync");
      glad_glIsSync = (PFNGLISSYNCPROC)(*load)("glIsSync");
      glad_glDeleteSync = (PFNGLDELETESYNCPROC)(*load)("glDeleteSync");
      glad_glClientWaitSync = (PFNGLCLIENTWAITSYNCPROC)(*load)("glClientWaitSync");
      glad_glWaitSync = (PFNGLWAITSYNCPROC)(*load)("glWaitSync");
      glad_glGetInteger64v = (PFNGLGETINTEGER64VPROC)(*load)("glGetInteger64v");
      glad_glGetSynciv = (PFNGLGETSYNCIVPROC)(*load)("glGetSynciv");
      glad_glGetInteger64i_v = (PFNGLGETINTEGER64I_VPROC)(*load)("glGetInteger64i_v");
      glad_glGetBufferParameteri64v =
           (PFNGLGETBUFFERPARAMETERI64VPROC)(*load)("glGetBufferParameteri64v");
      glad_glFramebufferTexture = (PFNGLFRAMEBUFFERTEXTUREPROC)(*load)("glFramebufferTexture");
      glad_glTexImage2DMultisample =
           (PFNGLTEXIMAGE2DMULTISAMPLEPROC)(*load)("glTexImage2DMultisample");
      glad_glTexImage3DMultisample =
           (PFNGLTEXIMAGE3DMULTISAMPLEPROC)(*load)("glTexImage3DMultisample");
      glad_glGetMultisamplefv = (PFNGLGETMULTISAMPLEFVPROC)(*load)("glGetMultisamplefv");
      glad_glSampleMaski = (PFNGLSAMPLEMASKIPROC)(*load)("glSampleMaski");
    }
  }
  return;
}

Assistant:

void gladLoadGLLoader(GLADloadproc load) {
	GLVersion.major = 0; GLVersion.minor = 0;
	glGetString = (PFNGLGETSTRINGPROC)load("glGetString");
	if(glGetString == NULL) return;
	find_coreGL();
	load_GL_VERSION_1_0(load);
	load_GL_VERSION_1_1(load);
	load_GL_VERSION_1_2(load);
	load_GL_VERSION_1_3(load);
	load_GL_VERSION_1_4(load);
	load_GL_VERSION_1_5(load);
	load_GL_VERSION_2_0(load);
	load_GL_VERSION_2_1(load);
	load_GL_VERSION_3_0(load);
	load_GL_VERSION_3_1(load);
	load_GL_VERSION_3_2(load);

	find_extensionsGL();

	return;
}